

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int checkcontrol(lua_State *L,char *message,int tocont)

{
  int iVar1;
  int tocont_local;
  char *message_local;
  lua_State *L_local;
  
  if ((tocont == 0) && (*message == '@')) {
    iVar1 = strcmp(message + 1,"off");
    if (iVar1 == 0) {
      lua_setwarnf(L,warnfoff,L);
    }
    else {
      iVar1 = strcmp(message + 1,"on");
      if (iVar1 == 0) {
        lua_setwarnf(L,warnfon,L);
      }
    }
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int checkcontrol (lua_State *L, const char *message, int tocont) {
  if (tocont || *(message++) != '@')  /* not a control message? */
    return 0;
  else {
    if (strcmp(message, "off") == 0)
      lua_setwarnf(L, warnfoff, L);  /* turn warnings off */
    else if (strcmp(message, "on") == 0)
      lua_setwarnf(L, warnfon, L);   /* turn warnings on */
    return 1;  /* it was a control message */
  }
}